

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::check_done
          (basic_json_parser<char,_std::allocator<char>_> *this,error_code *ec)

{
  bool bVar1;
  int iVar2;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RSI;
  ser_context *in_RDI;
  char_type curr_char_;
  json_errc in_stack_ffffffffffffffec;
  
  do {
    if (in_RDI[0xe]._vptr_ser_context == in_RDI[0xd]._vptr_ser_context) {
      return;
    }
    in_stack_ffffffffffffffec =
         CONCAT13(*(char *)in_RDI[0xe]._vptr_ser_context,(int3)in_stack_ffffffffffffffec);
    iVar2 = (int)*(char *)in_RDI[0xe]._vptr_ser_context;
    if (((1 < iVar2 - 9U) && (iVar2 != 0xd)) && (iVar2 != 0x20)) {
      bVar1 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                        (in_RSI,in_stack_ffffffffffffffec,in_RDI);
      *(bool *)((long)&in_RDI[0xf]._vptr_ser_context + 3) = bVar1;
      if (((ulong)in_RDI[0xf]._vptr_ser_context & 0x1000000) == 0) {
        std::error_code::operator=((error_code *)in_RSI,in_stack_ffffffffffffffec);
        return;
      }
    }
    in_RDI[0xe]._vptr_ser_context = (_func_int **)((long)in_RDI[0xe]._vptr_ser_context + 1);
  } while( true );
}

Assistant:

void check_done(std::error_code& ec)
    {
        for (; input_ptr_ != end_input_; ++input_ptr_)
        {
            char_type curr_char_ = *input_ptr_;
            switch (curr_char_)
            {
                case '\n':
                case '\r':
                case '\t':
                case ' ':
                    break;
                default:
                    more_ = err_handler_(json_errc::extra_character, *this);
                    if (!more_)
                    {
                        ec = json_errc::extra_character;
                        return;
                    }
                    break;
            }
        }
    }